

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_load_file(uchar **out,size_t *outsize,char *filename)

{
  size_t size_00;
  uchar *puVar1;
  long size;
  char *filename_local;
  size_t *outsize_local;
  uchar **out_local;
  
  size_00 = lodepng_filesize(filename);
  if ((long)size_00 < 0) {
    out_local._4_4_ = 0x4e;
  }
  else {
    *outsize = size_00;
    puVar1 = (uchar *)lodepng_malloc(size_00);
    *out = puVar1;
    if ((*out == (uchar *)0x0) && (0 < (long)size_00)) {
      out_local._4_4_ = 0x53;
    }
    else {
      out_local._4_4_ = lodepng_buffer_file(*out,size_00,filename);
    }
  }
  return out_local._4_4_;
}

Assistant:

unsigned lodepng_load_file(unsigned char** out, size_t* outsize, const char* filename)
{
  long size = lodepng_filesize(filename);
  if (size < 0) return 78;
  *outsize = (size_t)size;

  *out = (unsigned char*)lodepng_malloc((size_t)size);
  if(!(*out) && size > 0) return 83; /*the above malloc failed*/

  return lodepng_buffer_file(*out, (size_t)size, filename);
}